

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O0

bool __thiscall
aom::AV1RateControlRTC::InitRateControl(AV1RateControlRTC *this,AV1RateControlRtcConfig *rc_cfg)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  BLOCK_SIZE sb_size;
  int iVar6;
  PRIMARY_RATE_CONTROL *oxcf_00;
  PRIMARY_RATE_CONTROL *p_rc;
  long in_RSI;
  AV1RateControlRtcConfig *in_RDI;
  double d;
  AV1_LEVEL *lvl_idx;
  AV1_LEVEL *__end1;
  AV1_LEVEL *__begin1;
  AV1_LEVEL (*__range1) [32];
  RATE_CONTROL *rc;
  AV1EncoderConfig *oxcf;
  AV1_COMMON *cm;
  SequenceHeader *seq_params;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar7;
  AV1RateControlRtcConfig *rc_cfg_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  lVar1 = *(long *)in_RDI;
  lVar2 = *(long *)in_RDI;
  lVar3 = *(long *)in_RDI;
  *(undefined1 *)(*(long *)(lVar1 + 0x42008) + 0x45) = 0;
  *(undefined4 *)(*(long *)(lVar1 + 0x42008) + 0x48) = 8;
  *(undefined4 *)(lVar1 + 0x3c160) = 1;
  *(undefined1 *)(lVar2 + 0x42754) = *(undefined1 *)(*(long *)(lVar1 + 0x42008) + 0x45);
  *(undefined1 *)(lVar2 + 0x42770) = 1;
  *(undefined4 *)(lVar2 + 0x423dc) = 1;
  *(undefined4 *)(lVar2 + 0x42758) = 0;
  uVar7 = 0;
  if (*(int *)(in_RSI + 0xf8) != 0) {
    uVar7 = 3;
  }
  *(undefined1 *)(lVar2 + 0x42400) = uVar7;
  *(undefined4 *)(lVar2 + 0x4269c) = 0;
  *(undefined4 *)(lVar2 + 0x423c4) = *(undefined4 *)(in_RSI + 0x48);
  rc_cfg_00 = in_RDI;
  if (0 < *(int *)(in_RSI + 0x4c)) {
    d = ceil((*(double *)(*(long *)in_RDI + 0x608b0) * (double)*(int *)(in_RSI + 0x4c)) / 1000.0);
    iVar6 = saturate_cast_double_to_int(d);
    *(int *)(lVar3 + 0x6081c) = iVar6;
  }
  *(undefined4 *)(*(long *)in_RDI + 0x9d4b0) = 1;
  *(undefined4 *)(lVar2 + 0x42430) = 8;
  *(undefined4 *)(lVar2 + 0x42434) = 2;
  *(undefined4 *)(lVar2 + 0x42364) = 1;
  *(undefined4 *)(lVar1 + 0x3bf90) = 0;
  *(undefined4 *)(**(long **)in_RDI + 0x8b38) = 0x8fc;
  p_rc = (PRIMARY_RATE_CONTROL *)(lVar2 + 0x42754);
  for (oxcf_00 = (PRIMARY_RATE_CONTROL *)(lVar2 + 0x42734); oxcf_00 != p_rc;
      oxcf_00 = (PRIMARY_RATE_CONTROL *)((long)&oxcf_00->gf_group_bits + 1)) {
    *(undefined1 *)&oxcf_00->gf_group_bits = 0x1f;
  }
  lVar4 = **(long **)in_RDI;
  *(undefined8 *)(lVar4 + 0x5a90) = *(undefined8 *)(lVar2 + 0x42734);
  *(undefined8 *)(lVar4 + 0x5a98) = *(undefined8 *)(lVar2 + 0x4273c);
  *(undefined8 *)(lVar4 + 0x5aa0) = *(undefined8 *)(lVar2 + 0x42744);
  *(undefined8 *)(lVar4 + 0x5aa8) = *(undefined8 *)(lVar2 + 0x4274c);
  bVar5 = UpdateRateControl((AV1RateControlRTC *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),rc_cfg_00)
  ;
  if (bVar5) {
    seq_params = *(SequenceHeader **)(lVar1 + 0x42008);
    sb_size = av1_select_sb_size((AV1EncoderConfig *)(lVar2 + 0x42320),*(int *)(lVar1 + 0x3bfb8),
                                 *(int *)(lVar1 + 0x3bfbc),*(int *)(*(long *)in_RDI + 0x9d338));
    set_sb_size(seq_params,sb_size);
    uVar7 = true;
    if (*(int *)(*(long *)in_RDI + 0x9d338) < 2) {
      uVar7 = 1 < *(int *)(*(long *)in_RDI + 0x9d33c);
    }
    *(uint *)(**(long **)in_RDI + 0xc750) = (uint)(byte)uVar7;
    av1_primary_rc_init((AV1EncoderConfig *)oxcf_00,p_rc);
    *(undefined4 *)(lVar3 + 0x60834) = 0;
    *(undefined4 *)(lVar3 + 0x60838) = 0;
    av1_rc_init_minq_luts();
    av1_rc_init((AV1EncoderConfig *)CONCAT17(uVar7,in_stack_ffffffffffffffa0),
                (RATE_CONTROL *)seq_params);
    *(undefined4 *)(*(long *)in_RDI + 0x60870) = 1;
    *(undefined4 *)(*(long *)in_RDI + 0x60cb0) = 1;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool AV1RateControlRTC::InitRateControl(const AV1RateControlRtcConfig &rc_cfg) {
  AV1_COMMON *cm = &cpi_->common;
  AV1EncoderConfig *oxcf = &cpi_->oxcf;
  RATE_CONTROL *const rc = &cpi_->rc;
  cm->seq_params->profile = PROFILE_0;
  cm->seq_params->bit_depth = AOM_BITS_8;
  cm->show_frame = 1;
  oxcf->profile = cm->seq_params->profile;
  oxcf->mode = REALTIME;
  oxcf->rc_cfg.mode = AOM_CBR;
  oxcf->pass = AOM_RC_ONE_PASS;
  oxcf->q_cfg.aq_mode = rc_cfg.aq_mode ? CYCLIC_REFRESH_AQ : NO_AQ;
  oxcf->tune_cfg.content = AOM_CONTENT_DEFAULT;
  oxcf->rc_cfg.drop_frames_water_mark = rc_cfg.frame_drop_thresh;
  if (rc_cfg.max_consec_drop_ms > 0) {
    rc->max_consec_drop = saturate_cast_double_to_int(
        ceil(cpi_->framerate * rc_cfg.max_consec_drop_ms / 1000));
  }
  cpi_->svc.framedrop_mode = AOM_FULL_SUPERFRAME_DROP;
  oxcf->tool_cfg.bit_depth = AOM_BITS_8;
  oxcf->tool_cfg.superblock_size = AOM_SUPERBLOCK_SIZE_DYNAMIC;
  oxcf->algo_cfg.loopfilter_control = LOOPFILTER_ALL;
  cm->current_frame.frame_number = 0;
  cpi_->ppi->p_rc.kf_boost = DEFAULT_KF_BOOST_RT;
  for (auto &lvl_idx : oxcf->target_seq_level_idx) lvl_idx = SEQ_LEVEL_MAX;

  memcpy(cpi_->ppi->level_params.target_seq_level_idx,
         oxcf->target_seq_level_idx, sizeof(oxcf->target_seq_level_idx));
  if (!UpdateRateControl(rc_cfg)) return false;
  set_sb_size(cm->seq_params,
              av1_select_sb_size(oxcf, cm->width, cm->height,
                                 cpi_->svc.number_spatial_layers));
  cpi_->ppi->use_svc = cpi_->svc.number_spatial_layers > 1 ||
                       cpi_->svc.number_temporal_layers > 1;
  av1_primary_rc_init(oxcf, &cpi_->ppi->p_rc);
  rc->rc_1_frame = 0;
  rc->rc_2_frame = 0;
  av1_rc_init_minq_luts();
  av1_rc_init(oxcf, rc);
  // Enable external rate control.
  cpi_->rc.rtc_external_ratectrl = 1;
  cpi_->sf.rt_sf.use_nonrd_pick_mode = 1;
  return true;
}